

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_setBasis(void *highs,HighsInt *col_status,HighsInt *row_status)

{
  HighsInt HVar1;
  reference pvVar2;
  long in_RDX;
  long in_RSI;
  string *in_stack_00000048;
  HighsBasis *in_stack_00000050;
  HighsInt i_1;
  HighsInt num__row;
  HighsInt i;
  HighsInt num__col;
  HighsBasis basis;
  undefined4 in_stack_ffffffffffffff10;
  HighsStatus in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  string local_c8 [36];
  int local_a4;
  HighsInt local_a0;
  undefined4 local_9c;
  int local_98;
  HighsInt local_84;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_50;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_38;
  long local_20;
  long local_18;
  HighsStatus local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  HighsBasis::HighsBasis
            ((HighsBasis *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  HVar1 = Highs_getNumCol((void *)0x438d26);
  local_84 = HVar1;
  if (0 < HVar1) {
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
               CONCAT44(in_stack_ffffffffffffff34,HVar1),
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    for (local_98 = 0; local_98 < local_84; local_98 = local_98 + 1) {
      if (*(int *)(local_18 + (long)local_98 * 4) == 0) {
        pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (&local_50,(long)local_98);
        *pvVar2 = kLower;
      }
      else if (*(int *)(local_18 + (long)local_98 * 4) == 1) {
        pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (&local_50,(long)local_98);
        *pvVar2 = kBasic;
      }
      else if (*(int *)(local_18 + (long)local_98 * 4) == 2) {
        pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (&local_50,(long)local_98);
        *pvVar2 = kUpper;
      }
      else if (*(int *)(local_18 + (long)local_98 * 4) == 3) {
        pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (&local_50,(long)local_98);
        *pvVar2 = kZero;
      }
      else {
        if (*(int *)(local_18 + (long)local_98 * 4) != 4) {
          local_4 = kError;
          goto LAB_00439099;
        }
        pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (&local_50,(long)local_98);
        *pvVar2 = kNonbasic;
      }
    }
  }
  local_a0 = Highs_getNumRow((void *)0x438e9a);
  if (0 < local_a0) {
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
               CONCAT44(in_stack_ffffffffffffff34,HVar1),
               CONCAT44(local_a0,in_stack_ffffffffffffff28));
    for (local_a4 = 0; local_a4 < local_a0; local_a4 = local_a4 + 1) {
      if (*(int *)(local_20 + (long)local_a4 * 4) == 0) {
        pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (&local_38,(long)local_a4);
        *pvVar2 = kLower;
      }
      else if (*(int *)(local_20 + (long)local_a4 * 4) == 1) {
        pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (&local_38,(long)local_a4);
        *pvVar2 = kBasic;
      }
      else if (*(int *)(local_20 + (long)local_a4 * 4) == 2) {
        pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (&local_38,(long)local_a4);
        *pvVar2 = kUpper;
      }
      else if (*(int *)(local_20 + (long)local_a4 * 4) == 3) {
        pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (&local_38,(long)local_a4);
        *pvVar2 = kZero;
      }
      else {
        if (*(int *)(local_20 + (long)local_a4 * 4) != 4) {
          local_4 = kError;
          goto LAB_00439099;
        }
        pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (&local_38,(long)local_a4);
        *pvVar2 = kNonbasic;
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"",(allocator *)&stack0xffffffffffffff37);
  in_stack_ffffffffffffff14 = Highs::setBasis(_num__row,in_stack_00000050,in_stack_00000048);
  local_4 = in_stack_ffffffffffffff14;
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
LAB_00439099:
  local_9c = 1;
  HighsBasis::~HighsBasis
            ((HighsBasis *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  return local_4;
}

Assistant:

HighsInt Highs_setBasis(void* highs, const HighsInt* col_status,
                        const HighsInt* row_status) {
  HighsBasis basis;
  const HighsInt num__col = Highs_getNumCol(highs);
  if (num__col > 0) {
    basis.col_status.resize(num__col);
    for (HighsInt i = 0; i < num__col; i++) {
      if (col_status[i] == (HighsInt)HighsBasisStatus::kLower) {
        basis.col_status[i] = HighsBasisStatus::kLower;
      } else if (col_status[i] == (HighsInt)HighsBasisStatus::kBasic) {
        basis.col_status[i] = HighsBasisStatus::kBasic;
      } else if (col_status[i] == (HighsInt)HighsBasisStatus::kUpper) {
        basis.col_status[i] = HighsBasisStatus::kUpper;
      } else if (col_status[i] == (HighsInt)HighsBasisStatus::kZero) {
        basis.col_status[i] = HighsBasisStatus::kZero;
      } else if (col_status[i] == (HighsInt)HighsBasisStatus::kNonbasic) {
        basis.col_status[i] = HighsBasisStatus::kNonbasic;
      } else {
        return (HighsInt)HighsStatus::kError;
      }
    }
  }
  const HighsInt num__row = Highs_getNumRow(highs);
  if (num__row > 0) {
    basis.row_status.resize(num__row);
    for (HighsInt i = 0; i < num__row; i++) {
      if (row_status[i] == (HighsInt)HighsBasisStatus::kLower) {
        basis.row_status[i] = HighsBasisStatus::kLower;
      } else if (row_status[i] == (HighsInt)HighsBasisStatus::kBasic) {
        basis.row_status[i] = HighsBasisStatus::kBasic;
      } else if (row_status[i] == (HighsInt)HighsBasisStatus::kUpper) {
        basis.row_status[i] = HighsBasisStatus::kUpper;
      } else if (row_status[i] == (HighsInt)HighsBasisStatus::kZero) {
        basis.row_status[i] = HighsBasisStatus::kZero;
      } else if (row_status[i] == (HighsInt)HighsBasisStatus::kNonbasic) {
        basis.row_status[i] = HighsBasisStatus::kNonbasic;
      } else {
        return (HighsInt)HighsStatus::kError;
      }
    }
  }
  return (HighsInt)((Highs*)highs)->setBasis(basis);
}